

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

string * __thiscall helics::FederateState::getTag_abi_cxx11_(FederateState *this,string_view tag)

{
  __atomic_flag_data_type _Var1;
  pointer ppVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  string *unaff_R12;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *existingTag;
  pointer ppVar5;
  bool bVar6;
  
  __n = tag._M_len;
  do {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  ppVar5 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar3 = ppVar5 == ppVar2;
    if (bVar3) {
LAB_0032570e:
      if (bVar3) {
        LOCK();
        (this->processing).super___atomic_flag_base._M_i = false;
        UNLOCK();
        unaff_R12 = &gHelicsEmptyStr_abi_cxx11_;
      }
      return unaff_R12;
    }
    bVar6 = (ppVar5->first)._M_string_length == __n;
    if (bVar6 && __n != 0) {
      iVar4 = bcmp(tag._M_str,(ppVar5->first)._M_dataplus._M_p,__n);
      bVar6 = iVar4 == 0;
    }
    if (bVar6) {
      LOCK();
      (this->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      unaff_R12 = (string *)&ppVar5->second;
      goto LAB_0032570e;
    }
    ppVar5 = ppVar5 + 1;
  } while( true );
}

Assistant:

const std::string& FederateState::getTag(std::string_view tag) const
{
    spinlock();
    for (const auto& existingTag : tags) {
        if (existingTag.first == tag) {
            unlock();
            return existingTag.second;
        }
    }
    unlock();
    return gHelicsEmptyStr;
}